

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O3

void __thiscall soul::Structure::removeMember(Structure *this,string_view memberName)

{
  Member *pMVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  long *local_50 [2];
  long local_40 [2];
  
  p_Var2 = (_Hash_node_base *)getMemberIndex(this,memberName);
  for (p_Var3 = (this->memberIndexMap)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0
      ; p_Var3 = p_Var3->_M_nxt) {
    if (p_Var2 <= p_Var3[5]._M_nxt) {
      p_Var3[5]._M_nxt = (_Hash_node_base *)((long)&p_Var3[5]._M_nxt[-1]._M_nxt + 7);
    }
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,memberName._M_str,memberName._M_str + memberName._M_len);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&(this->memberIndexMap)._M_h,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pMVar1 = (this->members).items;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::erase
            (&this->members,pMVar1 + (long)p_Var2,pMVar1 + (long)((long)&p_Var2->_M_nxt + 1));
  return;
}

Assistant:

void Structure::removeMember (std::string_view memberName)
{
    auto i = getMemberIndex (memberName);

    for (auto& m : memberIndexMap)
        if (m.second >= i)
            m.second--;

    memberIndexMap.erase (std::string (memberName));
    members.erase (members.begin() + i);
}